

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_streaming_sample.cpp
# Opt level: O2

unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>,_true> __thiscall
duckdb::PhysicalStreamingSample::GetOperatorState
          (PhysicalStreamingSample *this,ExecutionContext *context)

{
  char cVar1;
  pointer pSVar2;
  _func_int **local_50;
  uint64_t local_48;
  RandomEngine random;
  
  cVar1 = (*(code *)(context->client->config).profiler_save_location._M_dataplus._M_p)(context);
  if (cVar1 == '\0') {
    pSVar2 = unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true>::
             operator->((unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true>
                         *)&context[5].thread);
    local_50 = (_func_int **)optional_idx::GetIndex(&pSVar2->seed);
    make_uniq<duckdb::StreamingSampleOperatorState,long>((duckdb *)&random,(long *)&local_50);
    (this->super_PhysicalOperator)._vptr_PhysicalOperator =
         (_func_int **)random.lock.super___mutex_base._M_mutex.__align;
  }
  else {
    RandomEngine::RandomEngine(&random,-1);
    local_48 = RandomEngine::NextRandomInteger64(&random);
    make_uniq<duckdb::StreamingSampleOperatorState,long>((duckdb *)&local_50,(long *)&local_48);
    (this->super_PhysicalOperator)._vptr_PhysicalOperator = local_50;
    RandomEngine::~RandomEngine(&random);
  }
  return (unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>_>)
         (unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>_>)this;
}

Assistant:

unique_ptr<OperatorState> PhysicalStreamingSample::GetOperatorState(ExecutionContext &context) const {
	if (!ParallelOperator()) {
		return make_uniq<StreamingSampleOperatorState>(static_cast<int64_t>(sample_options->seed.GetIndex()));
	}
	RandomEngine random;
	return make_uniq<StreamingSampleOperatorState>(static_cast<int64_t>(random.NextRandomInteger64()));
}